

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktMemoryAllocationTests.cpp
# Opt level: O0

void __thiscall
vkt::memory::anon_unknown_0::AllocateFreeTestInstance::AllocateFreeTestInstance
          (AllocateFreeTestInstance *this,Context *context,TestConfig *config)

{
  TestContext *this_00;
  TestLog *log;
  InstanceInterface *vk;
  VkPhysicalDevice physicalDevice;
  allocator<char> local_51;
  string local_50;
  TestConfig *local_20;
  TestConfig *config_local;
  Context *context_local;
  AllocateFreeTestInstance *this_local;
  
  local_20 = config;
  config_local = (TestConfig *)context;
  context_local = (Context *)this;
  TestInstance::TestInstance(&this->super_TestInstance,context);
  (this->super_TestInstance)._vptr_TestInstance =
       (_func_int **)&PTR__AllocateFreeTestInstance_01666630;
  TestConfig::TestConfig(&this->m_config,config);
  this_00 = vkt::Context::getTestContext((this->super_TestInstance).m_context);
  log = tcu::TestContext::getLog(this_00);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"",&local_51);
  tcu::ResultCollector::ResultCollector(&this->m_result,log,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator(&local_51);
  this->m_memoryTypeIndex = 0;
  vk = vkt::Context::getInstanceInterface((Context *)config_local);
  physicalDevice = vkt::Context::getPhysicalDevice((Context *)config_local);
  ::vk::getPhysicalDeviceMemoryProperties(&this->m_memoryProperties,vk,physicalDevice);
  return;
}

Assistant:

AllocateFreeTestInstance		(Context& context, const TestConfig config)
		: TestInstance			(context)
		, m_config				(config)
		, m_result				(m_context.getTestContext().getLog())
		, m_memoryTypeIndex		(0)
		, m_memoryProperties	(getPhysicalDeviceMemoryProperties(context.getInstanceInterface(), context.getPhysicalDevice()))
	{
		DE_ASSERT(!!m_config.memorySize != !!m_config.memoryPercentage);
	}